

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O3

void __thiscall
duckdb::Node::MergeIntoNode4(Node *this,ART *art,Node *l_node,Node *r_node,uint8_t pos)

{
  uint8_t uVar1;
  reference<Node> node;
  GateStatus GVar2;
  ulong uVar3;
  undefined7 in_register_00000081;
  ulong pos_00;
  Node l_child;
  reference<Node> ref;
  Prefix prefix;
  Node local_58;
  reference<Node> local_50;
  Prefix local_48;
  
  local_58.super_IndexPointer.data = (IndexPointer)0;
  Prefix::Prefix(&local_48,art,(Node)(l_node->super_IndexPointer).data,false,false);
  pos_00 = CONCAT71(in_register_00000081,pos) & 0xffffffff;
  uVar1 = local_48.data[pos_00];
  local_50._M_data = l_node;
  GVar2 = Prefix::Split(art,&local_50,&local_58,pos);
  node._M_data = local_50._M_data;
  BaseNode<(unsigned_char)'\x04',_(duckdb::NType)3>::New(art,local_50._M_data);
  if (GVar2 == GATE_NOT_SET) {
    uVar3 = ((node._M_data)->super_IndexPointer).data & 0x7fffffffffffffff;
  }
  else {
    if (GVar2 != GATE_SET) goto LAB_016e6692;
    uVar3 = ((node._M_data)->super_IndexPointer).data | 0x8000000000000000;
  }
  ((node._M_data)->super_IndexPointer).data = uVar3;
LAB_016e6692:
  Node4::InsertChild(art,node._M_data,uVar1,local_58);
  Prefix::Prefix(&local_48,art,(Node)(r_node->super_IndexPointer).data,false,false);
  uVar1 = local_48.data[pos_00];
  Prefix::Reduce(art,r_node,pos_00);
  Node4::InsertChild(art,node._M_data,uVar1,(Node)(r_node->super_IndexPointer).data);
  (r_node->super_IndexPointer).data = 0;
  return;
}

Assistant:

void Node::MergeIntoNode4(ART &art, Node &l_node, Node &r_node, const uint8_t pos) {
	Node l_child;
	auto l_byte = Prefix::GetByte(art, l_node, pos);

	reference<Node> ref(l_node);
	auto status = Prefix::Split(art, ref, l_child, pos);
	Node4::New(art, ref);
	ref.get().SetGateStatus(status);

	Node4::InsertChild(art, ref, l_byte, l_child);

	auto r_byte = Prefix::GetByte(art, r_node, pos);
	Prefix::Reduce(art, r_node, pos);
	Node4::InsertChild(art, ref, r_byte, r_node);
	r_node.Clear();
}